

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O1

int frame_codec_set_max_frame_size(FRAME_CODEC_HANDLE frame_codec,uint32_t max_frame_size)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if ((max_frame_size < 8 || frame_codec == (FRAME_CODEC_HANDLE)0x0) ||
     ((max_frame_size < frame_codec->receive_frame_size &&
      (frame_codec->receive_frame_state != RECEIVE_FRAME_STATE_FRAME_SIZE)))) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x98;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
                ,"frame_codec_set_max_frame_size",0x97,1,
                "Bad arguments: frame_codec = %p, max_frame_size = %u",frame_codec,
                (ulong)max_frame_size);
    }
  }
  else if (frame_codec->receive_frame_state == RECEIVE_FRAME_STATE_ERROR) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x9e;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
                ,"frame_codec_set_max_frame_size",0x9d,1,"Frame codec in error state");
    }
  }
  else {
    frame_codec->max_frame_size = max_frame_size;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int frame_codec_set_max_frame_size(FRAME_CODEC_HANDLE frame_codec, uint32_t max_frame_size)
{
    int result;
    FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;

    /* Codes_SRS_FRAME_CODEC_01_077: [If frame_codec is NULL, frame_codec_set_max_frame_size shall return a non-zero value.] */
    if ((frame_codec == NULL) ||
        /* Codes_SRS_FRAME_CODEC_01_078: [If max_frame_size is invalid according to the AMQP standard, frame_codec_set_max_frame_size shall return a non-zero value.] */
        (max_frame_size < FRAME_HEADER_SIZE) ||
        /* Codes_SRS_FRAME_CODEC_01_081: [If a frame being decoded already has a size bigger than the max_frame_size argument then frame_codec_set_max_frame_size shall return a non-zero value and the previous frame size shall be kept.] */
        ((max_frame_size < frame_codec_data->receive_frame_size) && (frame_codec_data->receive_frame_state != RECEIVE_FRAME_STATE_FRAME_SIZE)))
    {
        LogError("Bad arguments: frame_codec = %p, max_frame_size = %" PRIu32,
            frame_codec,
            max_frame_size);
        result = MU_FAILURE;
    }
    /* Codes_SRS_FRAME_CODEC_01_097: [Setting a frame size on a frame_codec that had a decode error shall fail.] */
    else if (frame_codec_data->receive_frame_state == RECEIVE_FRAME_STATE_ERROR)
    {
        LogError("Frame codec in error state");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_FRAME_CODEC_01_075: [frame_codec_set_max_frame_size shall set the maximum frame size for a frame_codec.] */
        /* Codes_SRS_FRAME_CODEC_01_079: [The new frame size shall take effect immediately, even for a frame that is being decoded at the time of the call.] */
        frame_codec_data->max_frame_size = max_frame_size;

        /* Codes_SRS_FRAME_CODEC_01_076: [On success, frame_codec_set_max_frame_size shall return 0.] */
        result = 0;
    }

    return result;
}